

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Population.h
# Opt level: O0

void __thiscall Population::~Population(Population *this)

{
  undefined8 *in_RDI;
  vector<Event_*,_std::allocator<Event_*>_> *unaff_retaddr;
  
  *in_RDI = &PTR_update_00198810;
  std::vector<Neuron_*,_std::allocator<Neuron_*>_>::~vector
            ((vector<Neuron_*,_std::allocator<Neuron_*>_> *)unaff_retaddr);
  std::vector<Event_*,_std::allocator<Event_*>_>::~vector(unaff_retaddr);
  return;
}

Assistant:

virtual ~Population() {}